

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O0

void refill_lamp(object *lamp,object *obj)

{
  short sVar1;
  loc_conflict grid;
  _Bool _Var2;
  _Bool local_29;
  object *poStack_28;
  _Bool none_left;
  object *used_1;
  object *used;
  object *obj_local;
  object *lamp_local;
  
  if (obj->timeout == 0) {
    sVar1 = obj->pval;
  }
  else {
    sVar1 = obj->timeout;
  }
  lamp->timeout = lamp->timeout + sVar1;
  used = obj;
  obj_local = lamp;
  msg("You fuel your lamp.");
  if ((int)(uint)z_info->fuel_lamp <= (int)obj_local->timeout) {
    obj_local->timeout = z_info->fuel_lamp;
    msg("Your lamp is full.");
  }
  _Var2 = flag_has_dbg(used->flags,5,0x14,"obj->flags","OF_TAKES_FUEL");
  if (_Var2) {
    if (used->number < 2) {
      used->timeout = 0;
    }
    else {
      used_1 = object_split(used,L'\x01');
      used_1->timeout = 0;
      _Var2 = object_is_carried(player,used);
      if ((_Var2) && (_Var2 = inven_carry_okay(used_1), _Var2)) {
        inven_carry(player,used_1,true,true);
      }
      else {
        grid.x = (player->grid).x;
        grid.y = (player->grid).y;
        drop_near((chunk *)cave,&used_1,L'\0',grid,false,true);
      }
    }
    player->upkeep->notice = player->upkeep->notice | 1;
    player->upkeep->redraw = player->upkeep->redraw | 0x20000;
  }
  else {
    local_29 = false;
    _Var2 = object_is_carried(player,used);
    if (_Var2) {
      poStack_28 = gear_object_for_use(player,used,L'\x01',true,&local_29);
    }
    else {
      poStack_28 = floor_object_for_use(player,used,L'\x01',true,&local_29);
    }
    if (poStack_28->known != (object *)0x0) {
      object_delete((chunk *)player->cave,(chunk *)0x0,&poStack_28->known);
    }
    object_delete((chunk *)cave,(chunk *)player->cave,&stack0xffffffffffffffd8);
  }
  player->upkeep->update = player->upkeep->update | 2;
  player->upkeep->redraw = player->upkeep->redraw | 0x40000;
  return;
}

Assistant:

static void refill_lamp(struct object *lamp, struct object *obj)
{
	/* Refuel */
	lamp->timeout += obj->timeout ? obj->timeout : obj->pval;

	/* Message */
	msg("You fuel your lamp.");

	/* Comment */
	if (lamp->timeout >= z_info->fuel_lamp) {
		lamp->timeout = z_info->fuel_lamp;
		msg("Your lamp is full.");
	}

	/* Refilled from a lantern */
	if (of_has(obj->flags, OF_TAKES_FUEL)) {
		/* Unstack if necessary */
		if (obj->number > 1) {
			/* Obtain a local object, split */
			struct object *used = object_split(obj, 1);

			/* Remove fuel */
			used->timeout = 0;

			/* Carry or drop */
			if (object_is_carried(player, obj) && inven_carry_okay(used))
				inven_carry(player, used, true, true);
			else
				drop_near(cave, &used, 0, player->grid, false, true);
		} else
			/* Empty a single lantern */
			obj->timeout = 0;

		/* Combine the pack (later) */
		player->upkeep->notice |= (PN_COMBINE);

		/* Redraw stuff */
		player->upkeep->redraw |= (PR_INVEN);
	} else { /* Refilled from a flask */
		struct object *used;
		bool none_left = false;

		/* Decrease the item from the pack or the floor */
		if (object_is_carried(player, obj)) {
			used = gear_object_for_use(player, obj, 1, true,
				&none_left);
		} else {
			used = floor_object_for_use(player, obj, 1, true,
				&none_left);
		}
		if (used->known)
			object_delete(player->cave, NULL, &used->known);
		object_delete(cave, player->cave, &used);
	}

	/* Recalculate torch */
	player->upkeep->update |= (PU_TORCH);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_EQUIP);
}